

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void poly1305_feed(poly1305 *ctx,uchar *buf,int len)

{
  uchar uVar1;
  int iVar2;
  int local_1c;
  uchar *puStack_18;
  int len_local;
  uchar *buf_local;
  poly1305 *ctx_local;
  
  local_1c = len;
  puStack_18 = buf;
  if (ctx->bufferIndex != 0) {
    for (; ctx->bufferIndex < 0x10 && local_1c != 0; local_1c = local_1c + -1) {
      uVar1 = *puStack_18;
      iVar2 = ctx->bufferIndex;
      ctx->bufferIndex = iVar2 + 1;
      ctx->buffer[iVar2] = uVar1;
      puStack_18 = puStack_18 + 1;
    }
    if (ctx->bufferIndex == 0x10) {
      poly1305_feed_chunk(ctx,ctx->buffer,0x10);
      ctx->bufferIndex = 0;
    }
  }
  for (; 0xf < local_1c; local_1c = local_1c + -0x10) {
    poly1305_feed_chunk(ctx,puStack_18,0x10);
    puStack_18 = puStack_18 + 0x10;
  }
  if (local_1c != 0) {
    memcpy(ctx->buffer,puStack_18,(long)local_1c);
    ctx->bufferIndex = local_1c;
  }
  return;
}

Assistant:

static void poly1305_feed(struct poly1305 *ctx,
                          const unsigned char *buf, int len)
{
    /* Check for stuff left in the buffer from last time */
    if (ctx->bufferIndex) {
        /* Try to fill up to 16 */
        while (ctx->bufferIndex < 16 && len) {
            ctx->buffer[ctx->bufferIndex++] = *buf++;
            --len;
        }
        if (ctx->bufferIndex == 16) {
            poly1305_feed_chunk(ctx, ctx->buffer, 16);
            ctx->bufferIndex = 0;
        }
    }

    /* Process 16 byte whole chunks */
    while (len >= 16) {
        poly1305_feed_chunk(ctx, buf, 16);
        len -= 16;
        buf += 16;
    }

    /* Cache stuff that's left over */
    if (len) {
        memcpy(ctx->buffer, buf, len);
        ctx->bufferIndex = len;
    }
}